

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O3

void __thiscall helics::Publication::publish(Publication *this,double val,string *units)

{
  pointer pcVar1;
  int iVar2;
  uint64_t match_flags;
  InvalidConversion *this_00;
  size_t __n;
  string_view message;
  precise_unit pVar3;
  precise_unit punit;
  string local_50;
  precise_unit local_30;
  
  __n = units->_M_string_length;
  if (__n == (this->pubUnits)._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((units->_M_dataplus)._M_p,(this->pubUnits)._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_001fdc2b;
    }
    publish(this,val);
    __n = units->_M_string_length;
  }
LAB_001fdc2b:
  pcVar1 = (units->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + __n);
  match_flags = ::units::getDefaultFlags();
  pVar3 = ::units::unit_from_string(&local_50,match_flags);
  local_30 = pVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pVar3.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar3.multiplier_)) {
    publish(this,val,&local_30);
    return;
  }
  this_00 = (InvalidConversion *)__cxa_allocate_exception(0x28);
  message._M_str = "unable to perform the requested conversion";
  message._M_len = 0x2a;
  InvalidConversion::InvalidConversion(this_00,message);
  __cxa_throw(this_00,&InvalidConversion::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Publication::publish(double val, const std::string& units)
{
    if (units == pubUnits) {
        publish(val);
    }
    auto punit = units::unit_from_string(units);
    if (units::is_valid(punit)) {
        publish(val, punit);
    } else {
        throw(InvalidConversion{});
    }
}